

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int root_recv_buffer(int sock,int *op,char *buffer,int buflen)

{
  uint32_t uVar1;
  undefined1 local_4e8 [8];
  char recbuf [1200];
  int local_30;
  uint32_t local_2c;
  int status;
  int len;
  int recv1;
  int buflen_local;
  char *buffer_local;
  int *op_local;
  int sock_local;
  
  status = 0;
  len = buflen;
  _recv1 = buffer;
  buffer_local = (char *)op;
  op_local._0_4_ = sock;
  op_local._4_4_ = NET_RecvRaw(sock,&local_2c,4);
  if (-1 < op_local._4_4_) {
    status = op_local._4_4_ + status;
    local_2c = ntohl(local_2c);
    local_2c = local_2c - 4;
    local_30 = NET_RecvRaw((int)op_local,buffer_local,4);
    op_local._4_4_ = local_30;
    if (-1 < local_30) {
      status = local_30 + status;
      uVar1 = ntohl(*(uint32_t *)buffer_local);
      *(uint32_t *)buffer_local = uVar1;
      if (0x4b0 < (int)local_2c) {
        local_2c = 0x4b0;
      }
      if (0 < (int)local_2c) {
        local_30 = NET_RecvRaw((int)op_local,local_4e8,local_2c);
        if (len < (int)local_2c) {
          local_2c = len;
        }
        memcpy(_recv1,local_4e8,(long)(int)local_2c);
        if (local_30 < 0) {
          return local_30;
        }
      }
      op_local._4_4_ = local_30 + status;
    }
  }
  return op_local._4_4_;
}

Assistant:

static int root_recv_buffer(int sock, int *op, char *buffer, int buflen)
{
  /* recv a buffer, the form is
     <len>
     <op>
     <buffer>
  */

  int recv1 = 0;
  int len;
  int status;
  char recbuf[MAXLEN];

  status = NET_RecvRaw(sock,&len,4);

  if (status < 0) {
    return status;
  }
  recv1 += status;

  len = ntohl(len);

  /* ok, have the length, recive the operation */
  len -= 4;
  status = NET_RecvRaw(sock,op,4);
  if (status < 0) {
    return status;
  }

  recv1 += status;

  *op = ntohl(*op);
  
  if (len > MAXLEN) {
    len = MAXLEN;
  }

  if (len > 0) { /* Get the rest of the message */
    status = NET_RecvRaw(sock,recbuf,len);
    if (len > buflen) {
      len = buflen;
    }
    memcpy(buffer,recbuf,len);
    if (status < 0) {
      return status;
    }
  } 

  recv1 += status;
  return recv1;

}